

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian_opt.h
# Opt level: O3

void image_32_filter_99_case(response_layer *layer,integral_image *iimage)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  float *pfVar5;
  float *pfVar6;
  bool *pbVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  uint uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  int iVar20;
  float *pfVar21;
  uint uVar22;
  float *pfVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  float *pfVar29;
  long lVar30;
  float *pfVar31;
  long lVar32;
  float *pfVar33;
  long lVar34;
  float *pfVar35;
  long lVar36;
  float *pfVar37;
  long lVar38;
  bool *pbVar39;
  float *pfVar40;
  uint uVar41;
  ulong uVar42;
  long lVar43;
  float fVar44;
  float *data;
  float *local_130;
  float *local_128;
  long local_100;
  float *local_f8;
  float *local_f0;
  float *local_e8;
  float *local_e0;
  int local_48;
  
  iVar2 = layer->height;
  iVar3 = iimage->data_width;
  lVar43 = (long)iVar3;
  pfVar5 = iimage->data;
  iVar20 = layer->filter_size;
  iVar4 = layer->step;
  lVar36 = (long)iVar4;
  lVar38 = layer->width * lVar36;
  uVar12 = iVar20 / 3;
  local_48 = iimage->width + -1;
  uVar14 = (iVar20 + -1) - (iVar20 + -1 >> 0x1f) >> 1;
  pfVar6 = layer->response;
  uVar42 = (ulong)(int)uVar12;
  fVar44 = 1.0 / (float)(iVar20 * iVar20);
  fVar1 = pfVar5[((long)iimage->height + -1) * lVar43 + -1 + (long)iimage->width];
  uVar13 = iVar20 / 6;
  pbVar7 = layer->laplacian;
  lVar25 = (long)(int)uVar13;
  iVar20 = (int)lVar38;
  if (iVar20 - uVar13 == 0 || iVar20 < (int)uVar13) {
    iVar24 = 0;
    lVar15 = 0;
  }
  else {
    lVar32 = (uVar42 - 1) * lVar43;
    lVar15 = lVar43 * uVar42;
    pfVar31 = pfVar5 + lVar15;
    pfVar16 = pfVar5 + -lVar43;
    pfVar21 = pfVar5 + ((int)uVar14 - lVar15);
    pfVar33 = pfVar5 + ~uVar42 * lVar43;
    pfVar29 = pfVar5 + (uVar42 - lVar43);
    local_f8 = pfVar5 + ((lVar32 + (uVar42 - 1)) - lVar25);
    local_e8 = pfVar5 + ((lVar32 + -1) - lVar25);
    local_100 = (lVar43 * -4 + 4) * uVar42 + lVar25 * -4 + -4 + (long)pfVar5;
    local_130 = (float *)((lVar43 * 4 + 4) * uVar42 + (long)pfVar5);
    lVar26 = (lVar25 * 4 + lVar15 * 4 ^ 0xfffffffffffffffcU) + (long)pfVar5;
    iVar24 = 0;
    pfVar17 = pfVar5 + lVar32 + (int)uVar14;
    lVar32 = lVar36 * lVar43;
    local_128 = pfVar5 + uVar42;
    lVar15 = 0;
    pfVar19 = pfVar5 + ~uVar42 * lVar43 + uVar42;
    pfVar23 = pfVar5;
    do {
      auVar11 = vfmadd213ss_fma(ZEXT416((uint)pfVar5[(int)((uVar12 + ~uVar13 + (int)lVar15) * iVar3
                                                          + local_48)]),
                                SUB6416(ZEXT464(0xc0400000),0),ZEXT416((uint)fVar1));
      if (0 < iVar20) {
        fVar8 = fVar44 * auVar11._0_4_;
        pfVar35 = pfVar6 + iVar24;
        pbVar39 = pbVar7 + iVar24;
        lVar27 = 0;
        uVar22 = ~uVar12;
        uVar41 = ~uVar14;
        do {
          auVar11 = vfmadd132ss_fma(ZEXT416((uint)((local_f8[lVar27] -
                                                   *(float *)(local_100 + lVar27 * 4)) +
                                                  (*(float *)(lVar26 + lVar27 * 4) -
                                                  local_e8[lVar27]))),
                                    ZEXT416((uint)((pfVar5[(lVar15 - uVar42) * lVar43 +
                                                           (long)(int)uVar41] -
                                                   pfVar5[(lVar15 + -1 + uVar42) * lVar43 +
                                                          (long)(int)uVar41]) +
                                                  (pfVar17[lVar27] - pfVar21[lVar27]))),
                                    SUB6416(ZEXT464(0xc0400000),0));
          fVar9 = fVar44 * auVar11._0_4_;
          fVar10 = fVar44 * ((((pfVar5[lVar15 * lVar43 + (long)(int)uVar22] -
                               pfVar5[(lVar15 + uVar42) * lVar43 + (long)(int)uVar22]) +
                               (pfVar31[lVar27 + -1] - pfVar23[lVar27 + -1]) +
                              (pfVar29[lVar27] - pfVar19[lVar27]) +
                              (pfVar33[lVar27] - pfVar16[lVar27])) -
                             ((pfVar5[((lVar15 - uVar42) + -1) * lVar43 + (long)(int)uVar22] -
                              pfVar5[(lVar15 + -1) * lVar43 + (long)(int)uVar22]) +
                             (pfVar16[lVar27 + -1] - pfVar33[lVar27 + -1]))) -
                            ((pfVar23[lVar27] - pfVar31[lVar27]) +
                            (local_130[lVar27] - local_128[lVar27])));
          auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * -0.81 * fVar10)),ZEXT416((uint)fVar9),
                                    ZEXT416((uint)fVar8));
          *pfVar35 = auVar11._0_4_;
          *pbVar39 = 0.0 <= fVar8 + fVar9;
          lVar27 = lVar27 + lVar36;
          pfVar35 = pfVar35 + 1;
          pbVar39 = pbVar39 + 1;
          iVar24 = iVar24 + 1;
          uVar41 = uVar41 + iVar4;
          uVar22 = uVar22 + iVar4;
        } while (lVar27 < lVar38);
      }
      local_e8 = local_e8 + lVar32;
      local_130 = local_130 + lVar32;
      lVar15 = lVar15 + lVar36;
      local_128 = local_128 + lVar32;
      local_f8 = local_f8 + lVar32;
      local_100 = local_100 + lVar32 * 4;
      pfVar31 = pfVar31 + lVar32;
      pfVar23 = pfVar23 + lVar32;
      pfVar16 = pfVar16 + lVar32;
      pfVar33 = pfVar33 + lVar32;
      pfVar21 = pfVar21 + lVar32;
      pfVar19 = pfVar19 + lVar32;
      lVar26 = lVar26 + lVar32 * 4;
      pfVar17 = pfVar17 + lVar32;
      pfVar29 = pfVar29 + lVar32;
    } while (lVar15 < (long)(ulong)(iVar20 - uVar13));
  }
  fVar1 = fVar1 * -2.0;
  lVar38 = (long)(int)(uVar13 + 1);
  if ((int)lVar15 <= (int)uVar13) {
    lVar15 = (long)(int)lVar15;
    lVar26 = lVar36 * lVar43;
    fVar8 = fVar44 * fVar1;
    lVar34 = (lVar15 - uVar42) * lVar43;
    lVar30 = (lVar15 + -1 + uVar42) * lVar43;
    lVar32 = (lVar15 + uVar42) * lVar43;
    pfVar33 = pfVar5 + lVar32;
    lVar28 = (lVar15 + -1) * lVar43;
    lVar27 = ((lVar15 + -1) - uVar42) * lVar43;
    pfVar23 = pfVar5 + lVar15 * lVar43;
    pfVar16 = pfVar5 + ((lVar34 + uVar42) - lVar38);
    pfVar21 = pfVar5 + (lVar34 - lVar38);
    pfVar40 = pfVar5 + lVar30 + (int)uVar14;
    pfVar35 = pfVar5 + ((lVar30 + uVar42) - lVar38);
    pfVar17 = pfVar5 + lVar28;
    local_128 = pfVar5 + lVar15 * lVar43 + uVar42;
    local_130 = pfVar5 + lVar28 + uVar42;
    local_e0 = pfVar5 + lVar27 + uVar42;
    pfVar31 = pfVar5 + lVar27;
    pfVar37 = pfVar5 + lVar32 + uVar42;
    pfVar29 = pfVar5 + lVar34 + (int)uVar14;
    pfVar19 = pfVar5 + (lVar30 - lVar38);
    do {
      if (0 < iVar20) {
        lVar32 = 0;
        pfVar18 = pfVar6 + iVar24;
        pbVar39 = pbVar7 + iVar24;
        uVar22 = ~uVar12;
        uVar41 = ~uVar14;
        do {
          auVar11 = vfmadd132ss_fma(ZEXT416((uint)((pfVar35[lVar32] - pfVar16[lVar32]) +
                                                  (pfVar21[lVar32] - pfVar19[lVar32]))),
                                    ZEXT416((uint)((pfVar5[(lVar15 - uVar42) * lVar43 +
                                                           (long)(int)uVar41] -
                                                   pfVar5[(lVar15 + -1 + uVar42) * lVar43 +
                                                          (long)(int)uVar41]) +
                                                  (pfVar40[lVar32] - pfVar29[lVar32]))),
                                    SUB6416(ZEXT464(0xc0400000),0));
          fVar9 = fVar44 * auVar11._0_4_;
          fVar10 = fVar44 * ((((pfVar5[lVar15 * lVar43 + (long)(int)uVar22] -
                               pfVar5[(lVar15 + uVar42) * lVar43 + (long)(int)uVar22]) +
                               (pfVar33[lVar32 + -1] - pfVar23[lVar32 + -1]) +
                              (local_130[lVar32] - local_e0[lVar32]) +
                              (pfVar31[lVar32] - pfVar17[lVar32])) -
                             ((pfVar5[((lVar15 - uVar42) + -1) * lVar43 + (long)(int)uVar22] -
                              pfVar5[(lVar15 + -1) * lVar43 + (long)(int)uVar22]) +
                             (pfVar17[lVar32 + -1] - pfVar31[lVar32 + -1]))) -
                            ((pfVar23[lVar32] - pfVar33[lVar32]) +
                            (pfVar37[lVar32] - local_128[lVar32])));
          auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * -0.81 * fVar10)),ZEXT416((uint)fVar9),
                                    ZEXT416((uint)fVar8));
          *pfVar18 = auVar11._0_4_;
          *pbVar39 = 0.0 <= fVar8 + fVar9;
          lVar32 = lVar32 + lVar36;
          pfVar18 = pfVar18 + 1;
          pbVar39 = pbVar39 + 1;
          iVar24 = iVar24 + 1;
          uVar41 = uVar41 + iVar4;
          uVar22 = uVar22 + iVar4;
        } while (lVar32 < iVar20);
      }
      local_130 = local_130 + lVar26;
      lVar15 = lVar15 + lVar36;
      local_e0 = local_e0 + lVar26;
      local_128 = local_128 + lVar26;
      pfVar33 = pfVar33 + lVar26;
      pfVar23 = pfVar23 + lVar26;
      pfVar17 = pfVar17 + lVar26;
      pfVar31 = pfVar31 + lVar26;
      pfVar21 = pfVar21 + lVar26;
      pfVar40 = pfVar40 + lVar26;
      pfVar29 = pfVar29 + lVar26;
      pfVar37 = pfVar37 + lVar26;
      pfVar35 = pfVar35 + lVar26;
      pfVar19 = pfVar19 + lVar26;
      pfVar16 = pfVar16 + lVar26;
    } while (lVar15 <= lVar25);
  }
  lVar25 = iVar2 * lVar36;
  if ((int)lVar15 < (int)lVar25) {
    lVar34 = (long)(int)lVar15;
    lVar15 = lVar36 * lVar43;
    lVar28 = (lVar34 - uVar42) * lVar43;
    lVar30 = (lVar34 + uVar42) * lVar43;
    lVar26 = (lVar34 + -1 + uVar42) * lVar43;
    lVar27 = (lVar34 + -1) * lVar43;
    lVar32 = ((lVar34 + -1) - uVar42) * lVar43;
    pfVar31 = pfVar5 + lVar30;
    pfVar33 = pfVar5 + lVar34 * lVar43;
    pfVar29 = pfVar5 + ((lVar28 + uVar42) - lVar38);
    pfVar17 = pfVar5 + (lVar28 - lVar38);
    pfVar40 = pfVar5 + lVar28 + (int)uVar14;
    pfVar21 = pfVar5 + lVar30 + uVar42;
    pfVar19 = pfVar5 + ((lVar26 + uVar42) - lVar38);
    pfVar23 = pfVar5 + lVar27;
    local_f0 = pfVar5 + lVar32;
    local_130 = pfVar5 + lVar34 * lVar43 + uVar42;
    local_128 = pfVar5 + lVar27 + uVar42;
    pfVar37 = pfVar5 + lVar32 + uVar42;
    pfVar35 = pfVar5 + (lVar26 - lVar38);
    pfVar16 = pfVar5 + lVar26 + (int)uVar14;
    do {
      auVar11 = vfmadd213ss_fma(ZEXT416((uint)pfVar5[(int)((~uVar13 + (int)lVar34) * iVar3 +
                                                          local_48)]),SUB6416(ZEXT464(0x40400000),0)
                                ,ZEXT416((uint)fVar1));
      if (0 < iVar20) {
        fVar8 = fVar44 * auVar11._0_4_;
        pfVar18 = pfVar6 + iVar24;
        pbVar39 = pbVar7 + iVar24;
        lVar38 = 0;
        uVar22 = ~uVar12;
        uVar41 = ~uVar14;
        do {
          auVar11 = vfmadd132ss_fma(ZEXT416((uint)((pfVar17[lVar38] - pfVar35[lVar38]) +
                                                  (pfVar19[lVar38] - pfVar29[lVar38]))),
                                    ZEXT416((uint)((pfVar16[lVar38] - pfVar40[lVar38]) +
                                                  (pfVar5[(lVar34 - uVar42) * lVar43 +
                                                          (long)(int)uVar41] -
                                                  pfVar5[(lVar34 + -1 + uVar42) * lVar43 +
                                                         (long)(int)uVar41]))),
                                    SUB6416(ZEXT464(0xc0400000),0));
          fVar9 = auVar11._0_4_ * fVar44;
          fVar10 = fVar44 * ((((pfVar5[lVar34 * lVar43 + (long)(int)uVar22] -
                               pfVar5[(lVar34 + uVar42) * lVar43 + (long)(int)uVar22]) +
                               (pfVar31[lVar38 + -1] - pfVar33[lVar38 + -1]) +
                              (local_128[lVar38] - pfVar37[lVar38]) +
                              (local_f0[lVar38] - pfVar23[lVar38])) -
                             ((pfVar5[((lVar34 - uVar42) + -1) * lVar43 + (long)(int)uVar22] -
                              pfVar5[(lVar34 + -1) * lVar43 + (long)(int)uVar22]) +
                             (pfVar23[lVar38 + -1] - local_f0[lVar38 + -1]))) -
                            ((pfVar33[lVar38] - pfVar31[lVar38]) +
                            (pfVar21[lVar38] - local_130[lVar38])));
          auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * -0.81 * fVar10)),ZEXT416((uint)fVar9),
                                    ZEXT416((uint)fVar8));
          *pfVar18 = auVar11._0_4_;
          *pbVar39 = 0.0 <= fVar9 + fVar8;
          lVar38 = lVar38 + lVar36;
          pfVar18 = pfVar18 + 1;
          pbVar39 = pbVar39 + 1;
          iVar24 = iVar24 + 1;
          uVar41 = uVar41 + iVar4;
          uVar22 = uVar22 + iVar4;
        } while (lVar38 < iVar20);
      }
      local_f0 = local_f0 + lVar15;
      local_128 = local_128 + lVar15;
      lVar34 = lVar34 + lVar36;
      local_130 = local_130 + lVar15;
      pfVar31 = pfVar31 + lVar15;
      pfVar33 = pfVar33 + lVar15;
      pfVar23 = pfVar23 + lVar15;
      pfVar35 = pfVar35 + lVar15;
      pfVar17 = pfVar17 + lVar15;
      pfVar16 = pfVar16 + lVar15;
      pfVar40 = pfVar40 + lVar15;
      pfVar21 = pfVar21 + lVar15;
      pfVar37 = pfVar37 + lVar15;
      pfVar19 = pfVar19 + lVar15;
      pfVar29 = pfVar29 + lVar15;
    } while (lVar34 < lVar25);
  }
  return;
}

Assistant:

inline void image_32_filter_99_case(struct response_layer *layer, struct integral_image *iimage) {
    int height = layer->height;
    int width = layer->width;

    int data_width = iimage->data_width;

    int iwidth = iimage->width;
    int iheight = iimage->height;

    float *data = (float *) iimage->data;
    int step = layer->step;
    int filter_size = layer->filter_size;
    int border = (filter_size - 1) / 2;
    int lobe = filter_size / 3;
    float inv_area = 1.f/(filter_size*filter_size);

    float Dxx, Dyy, Dxy, Dyy0, Dyy1, A, B, C, D;
    float A0, A1, B0, B1, C0, C1, D0, D1;
    int r10, r11, c10, c11, r00, r01, c00, c01;
    float* response = layer->response;
    bool* laplacian = layer->laplacian;

    int ind = 0;

    int k, k0, i, j, t0, t1, t2, t3, t4, t5, t6, t7, t8, t9;
    int x = 0;
    int y = 0;

    // Case 2.2a the filter is longer and wider than the image.

    // D is right bottom corner or to the right (possibly below image)
    // A, B, C = 0
    D0 = data[(iheight-1) * data_width + (iwidth-1)];


    // We divide it again in 3 parts.
    // 1. B outside, D inside
    // 2. B outside, D outside
    // 3. B inside, D outside

    // 1. Case: B outside, D inside
    for (x = 0; x < width*step-lobe/2; x += step) {
        // negative part
        r10 = x - lobe / 2 - 1;
        r11 = r10 + lobe;  // TODO: fix this

        D1 = data[r11 * data_width + (iwidth-1)];

        // Compute Dyy
        Dyy = D0 - 3 * D1;
        Dyy *= inv_area;

        // precompute
        t0 = x - lobe;
        t1 = x + lobe - 1;
        t2 = lobe/2 + 1;
        t3 = x - 1;
        t5 = x - lobe - 1;
        t7 = x + lobe;

        for (y = 0; y < width * step; y += step) {
            // box_integral_unconditional precompute
            t4 = y - 1;
            t6 = y - lobe - 1;
            t8 = y + lobe;

            // Compute Dxx, Dxy
            Dxx = box_integral_unconditional_opt(iimage, t0, y-border-1, t1, y+border)
                - 3 * box_integral_unconditional_opt(iimage, t0, y-t2, t1, t8-t2);
            Dxy = box_integral_unconditional_opt(iimage, t5, y, t3, t8)
                    + box_integral_unconditional_opt(iimage, x, t6, t7, t4)
                    - box_integral_unconditional_opt(iimage, t5, t6, t3, t4)
                    - box_integral_unconditional_opt(iimage, x, y, t7, t8);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = Dxx + Dyy >= 0;
            ind += 1;
        }
    }

    // 2. Case: B outside, D outside
    Dyy = - 2 * D0;
    Dyy *= inv_area;

    for (; x < lobe/2+1; x += step) {

        // precompute
        t0 = x - lobe;
        t1 = x + lobe - 1;
        t2 = lobe/2 + 1;
        t3 = x - 1;
        t5 = x - lobe - 1;
        t7 = x + lobe;

        for (y = 0; y < width*step; y += step) {
            // box_integral_unconditional precompute
            t4 = y - 1;
            t6 = y - lobe - 1;
            t8 = y + lobe;

            // Compute Dxx, Dxy
            Dxx = box_integral_unconditional_opt(iimage, t0, y-border-1, t1, y+border)
                - 3 * box_integral_unconditional_opt(iimage, t0, y-t2, t1, t8-t2);
            Dxy = box_integral_unconditional_opt(iimage, t5, y, t3, t8)
                    + box_integral_unconditional_opt(iimage, x, t6, t7, t4)
                    - box_integral_unconditional_opt(iimage, t5, t6, t3, t4)
                    - box_integral_unconditional_opt(iimage, x, y, t7, t8);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = Dxx + Dyy >= 0;
            ind += 1;
        }
    }

    // 3. Case: B inside, D outside
    for (; x < height * step; x += step) {
        r10 = x - lobe / 2 - 1;

        B = data[r10 * data_width + (iwidth-1)];
        // D1 = D0 - B;
        // Dyy = D0 - 3 * D1;
        // Dyy *= inv_area;

        // this can be simplified to:
        // (small difference in original is this but error is <0.000001 eps)
        Dyy = 3*B - 2*D0;
        Dyy *= inv_area;

        // precompute
        t0 = x - lobe;
        t1 = x + lobe - 1;
        t2 = lobe/2 + 1;
        t3 = x - 1;
        t5 = x - lobe - 1;
        t7 = x + lobe;

        for (y = 0; y < width * step; y += step) {
            // box_integral_unconditional precompute
            t4 = y - 1;
            t6 = y - lobe - 1;
            t8 = y + lobe;

            // Compute Dxx, Dxy
            Dxx = box_integral_unconditional_opt(iimage, t0, y-border-1, t1, y+border)
                - 3 * box_integral_unconditional_opt(iimage, t0, y-t2, t1, t8-t2);
            Dxy = box_integral_unconditional_opt(iimage, t5, y, t3, t8)
                    + box_integral_unconditional_opt(iimage, x, t6, t7, t4)
                    - box_integral_unconditional_opt(iimage, t5, t6, t3, t4)
                    - box_integral_unconditional_opt(iimage, x, y, t7, t8);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = Dxx + Dyy >= 0;
            ind += 1;
        }
    }
}